

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

int __thiscall
google::protobuf::Reflection::GetEnumValue(Reflection *this,Message *message,FieldDescriptor *field)

{
  byte bVar1;
  int iVar2;
  uint32_t uVar3;
  int *piVar4;
  EnumValueDescriptor *pEVar5;
  Nonnull<const_char_*> pcVar6;
  bool bVar7;
  char *description;
  OneofDescriptor *oneof_descriptor;
  Descriptor *pDVar8;
  Metadata MVar9;
  
  MVar9 = Message::GetMetadata(message);
  if (MVar9.reflection != this) {
    pDVar8 = this->descriptor_;
    MVar9 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar8,MVar9.descriptor,field,"GetEnumValue");
  }
  pDVar8 = this->descriptor_;
  if (field->containing_type_ == pDVar8) {
    bVar1 = field->field_0x1;
    bVar7 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar7) {
      pcVar6 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (bVar7,0xbf < bVar1,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar6 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 8) {
          anon_unknown_6::ReportReflectionUsageTypeError
                    (this->descriptor_,field,"GetEnumValue",CPPTYPE_ENUM);
        }
        if ((field->field_0x1 & 8) != 0) {
          uVar3 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
          iVar2 = field->number_;
          pEVar5 = FieldDescriptor::default_value_enum(field);
          iVar2 = internal::ExtensionSet::GetEnum
                            ((ExtensionSet *)
                             ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),
                             iVar2,pEVar5->number_);
          return iVar2;
        }
        bVar7 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
        if (bVar7) {
          if ((field->field_0x1 & 0x10) == 0) {
            oneof_descriptor = (OneofDescriptor *)0x0;
          }
          else {
            oneof_descriptor = (field->scope_).containing_oneof;
            if (oneof_descriptor == (OneofDescriptor *)0x0) {
              internal::protobuf_assumption_failed
                        ("res != nullptr",
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb31);
            }
          }
          uVar3 = GetOneofCase(this,message,oneof_descriptor);
          if (uVar3 != field->number_) {
            pEVar5 = FieldDescriptor::default_value_enum(field);
            return pEVar5->number_;
          }
        }
        piVar4 = GetRaw<int>(this,message,field);
        return *piVar4;
      }
    }
    else {
      GetEnumValue();
    }
    pDVar8 = this->descriptor_;
    description = "Field is repeated; the method requires a singular field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar8,field,"GetEnumValue",description);
}

Assistant:

int Reflection::GetEnumValue(const Message& message,
                             const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetEnumValue, SINGULAR, ENUM);

  int32_t value;
  if (field->is_extension()) {
    value = GetExtensionSet(message).GetEnum(
        field->number(), field->default_value_enum()->number());
  } else if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
    value = field->default_value_enum()->number();
  } else {
    value = GetField<int>(message, field);
  }
  return value;
}